

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cpp
# Opt level: O0

bool stackjit::TypeSystem::areEqual
               (vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_> *list1,
               vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_> *list2)

{
  Type *this;
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  const_reference ppTVar4;
  ulong local_28;
  size_t i;
  vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_> *list2_local;
  vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_> *list1_local;
  
  sVar2 = std::vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>::size(list1);
  sVar3 = std::vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>::size(list2);
  if (sVar2 == sVar3) {
    for (local_28 = 0;
        sVar2 = std::vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>::size
                          (list1), local_28 < sVar2; local_28 = local_28 + 1) {
      ppTVar4 = std::vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>::
                operator[](list1,local_28);
      this = *ppTVar4;
      ppTVar4 = std::vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>::
                operator[](list2,local_28);
      bVar1 = Type::operator!=(this,*ppTVar4);
      if (bVar1) {
        return false;
      }
    }
    list1_local._7_1_ = true;
  }
  else {
    list1_local._7_1_ = false;
  }
  return list1_local._7_1_;
}

Assistant:

bool TypeSystem::areEqual(const std::vector<const Type*>& list1, const std::vector<const Type*>& list2) {
		if (list1.size() != list2.size()) {
			return false;
		}

		for (std::size_t i = 0; i < list1.size(); i++) {
			if (*list1[i] != *list2[i]) {
				return false;
			}
		}

		return true;
	}